

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  byte bVar1;
  ushort x;
  ushort uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  undefined1 uVar6;
  uint pos;
  uint uVar7;
  long *plVar8;
  long *plVar9;
  
  iVar3 = (r1->high_low_container).size;
  iVar4 = (r2->high_low_container).size;
  pos = 0;
  if (0 < iVar3) {
    for (; (int)pos < iVar4; pos = ra_advance_until(&r2->high_low_container,x,pos)) {
      x = *(r1->high_low_container).keys;
      uVar7 = pos & 0xffff;
      uVar2 = (r2->high_low_container).keys[uVar7];
      if (x == uVar2) {
        bVar5 = *(r1->high_low_container).typecodes;
        plVar9 = (long *)*(r1->high_low_container).containers;
        if (bVar5 == 4) {
          bVar5 = *(byte *)(plVar9 + 1);
          plVar9 = (long *)*plVar9;
        }
        bVar1 = (r2->high_low_container).typecodes[uVar7];
        plVar8 = (long *)(r2->high_low_container).containers[uVar7];
        if (bVar1 == 4) {
          bVar1 = *(byte *)(plVar8 + 1);
          plVar8 = (long *)*plVar8;
        }
        uVar6 = (*(code *)(&DAT_0011b730 +
                          *(int *)(&DAT_0011b730 + (ulong)(((uint)bVar1 + (uint)bVar5 * 4) - 5) * 4)
                          ))(plVar9,plVar8);
        return (_Bool)uVar6;
      }
      if (x < uVar2) {
        return false;
      }
    }
  }
  return iVar3 == 0;
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size, length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, (uint16_t)pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 =
                ra_get_container_at_index(ra1, (uint16_t)pos1, &type1);
            container_t *c2 =
                ra_get_container_at_index(ra2, (uint16_t)pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2)) return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}